

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TgTypeParser.cpp
# Opt level: O0

Ptr __thiscall TgBot::TgTypeParser::parseJsonAndGetInlineQuery(TgTypeParser *this,ptree *data)

{
  basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>> *pbVar1;
  element_type *peVar2;
  basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>> *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Ptr PVar3;
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  code *local_120;
  undefined8 local_118;
  allocator local_109;
  string local_108 [32];
  shared_ptr<TgBot::Location> local_e8;
  code *local_d8;
  undefined8 local_d0;
  allocator local_c1;
  string local_c0 [32];
  shared_ptr<TgBot::User> local_a0 [2];
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  undefined1 local_21;
  basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>> *local_20;
  ptree *data_local;
  TgTypeParser *this_local;
  shared_ptr<TgBot::InlineQuery> *result;
  
  local_21 = 0;
  local_20 = in_RDX;
  data_local = data;
  this_local = this;
  std::make_shared<TgBot::InlineQuery>();
  pbVar1 = local_20;
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::string_path(&local_78,"id",0x2e);
  boost::property_tree::
  basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>::
  get<std::__cxx11::string>(&local_48,pbVar1,&local_78);
  peVar2 = std::__shared_ptr_access<TgBot::InlineQuery,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<TgBot::InlineQuery,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  std::__cxx11::string::operator=((string *)peVar2,(string *)&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~string_path(&local_78);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c0,"from",&local_c1);
  local_d8 = parseJsonAndGetUser;
  local_d0 = 0;
  tryParseJson<TgBot::User>
            ((TgTypeParser *)local_a0,(JsonToTgTypeFunc<TgBot::User>)data,
             (ptree *)parseJsonAndGetUser,(string *)0x0);
  peVar2 = std::__shared_ptr_access<TgBot::InlineQuery,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<TgBot::InlineQuery,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  std::shared_ptr<TgBot::User>::operator=(&peVar2->from,local_a0);
  std::shared_ptr<TgBot::User>::~shared_ptr(local_a0);
  std::__cxx11::string::~string(local_c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_108,"location",&local_109);
  local_120 = parseJsonAndGetLocation;
  local_118 = 0;
  tryParseJson<TgBot::Location>
            ((TgTypeParser *)&local_e8,(JsonToTgTypeFunc<TgBot::Location>)data,
             (ptree *)parseJsonAndGetLocation,(string *)0x0);
  peVar2 = std::__shared_ptr_access<TgBot::InlineQuery,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<TgBot::InlineQuery,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  std::shared_ptr<TgBot::Location>::operator=(&peVar2->location,&local_e8);
  std::shared_ptr<TgBot::Location>::~shared_ptr(&local_e8);
  std::__cxx11::string::~string(local_108);
  std::allocator<char>::~allocator((allocator<char> *)&local_109);
  pbVar1 = local_20;
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::string_path(&local_170,"query",0x2e);
  boost::property_tree::
  basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>::
  get<std::__cxx11::string>(&local_140,pbVar1,&local_170);
  peVar2 = std::__shared_ptr_access<TgBot::InlineQuery,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<TgBot::InlineQuery,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  std::__cxx11::string::operator=((string *)&peVar2->query,(string *)&local_140);
  std::__cxx11::string::~string((string *)&local_140);
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~string_path(&local_170);
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::string_path(&local_1c8,"offset",0x2e);
  boost::property_tree::
  basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>::
  get<std::__cxx11::string>(&local_198,local_20,&local_1c8);
  peVar2 = std::__shared_ptr_access<TgBot::InlineQuery,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<TgBot::InlineQuery,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  std::__cxx11::string::operator=((string *)&peVar2->offset,(string *)&local_198);
  std::__cxx11::string::~string((string *)&local_198);
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~string_path(&local_1c8);
  PVar3.super___shared_ptr<TgBot::InlineQuery,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  PVar3.super___shared_ptr<TgBot::InlineQuery,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Ptr)PVar3.super___shared_ptr<TgBot::InlineQuery,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

InlineQuery::Ptr TgTypeParser::parseJsonAndGetInlineQuery(const boost::property_tree::ptree& data) const {
    auto result(make_shared<InlineQuery>());
    result->id = data.get<string>("id");
    result->from = tryParseJson<User>(&TgTypeParser::parseJsonAndGetUser, data, "from");
    result->location = tryParseJson<Location>(&TgTypeParser::parseJsonAndGetLocation, data, "location");
    result->query = data.get<string>("query");
    result->offset = data.get<string>("offset");

    return result;
}